

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void calc_proj_params_r0_r1_high_bd_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t f2;
  int32_t f1;
  int32_t s;
  int32_t u;
  int j;
  int i;
  uint16_t *dat;
  uint16_t *src;
  int size;
  int dat_stride_local;
  uint8_t *dat8_local;
  int src_stride_local;
  int height_local;
  int width_local;
  uint8_t *src8_local;
  
  iVar2 = width * height;
  for (i = 0; i < height; i = i + 1) {
    for (j = 0; j < width; j = j + 1) {
      uVar1 = (uint)*(ushort *)((long)dat8 * 2 + (long)(i * dat_stride + j) * 2);
      iVar3 = (uint)*(ushort *)((long)src8 * 2 + (long)(i * src_stride + j) * 2) * 0x10 +
              uVar1 * -0x10;
      iVar4 = flt0[i * flt0_stride + j] + uVar1 * -0x10;
      iVar5 = flt1[i * flt1_stride + j] + uVar1 * -0x10;
      (*H)[0] = (long)iVar4 * (long)iVar4 + (*H)[0];
      H[1][1] = (long)iVar5 * (long)iVar5 + H[1][1];
      (*H)[1] = (long)iVar4 * (long)iVar5 + (*H)[1];
      *C = (long)iVar4 * (long)iVar3 + *C;
      C[1] = (long)iVar5 * (long)iVar3 + C[1];
    }
  }
  (*H)[0] = (*H)[0] / (long)iVar2;
  (*H)[1] = (*H)[1] / (long)iVar2;
  H[1][1] = H[1][1] / (long)iVar2;
  H[1][0] = (*H)[1];
  *C = *C / (long)iVar2;
  C[1] = C[1] / (long)iVar2;
  return;
}

Assistant:

static inline void calc_proj_params_r0_r1_high_bd_c(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int32_t u = (int32_t)(dat[i * dat_stride + j] << SGRPROJ_RST_BITS);
      const int32_t s =
          (int32_t)(src[i * src_stride + j] << SGRPROJ_RST_BITS) - u;
      const int32_t f1 = (int32_t)flt0[i * flt0_stride + j] - u;
      const int32_t f2 = (int32_t)flt1[i * flt1_stride + j] - u;
      H[0][0] += (int64_t)f1 * f1;
      H[1][1] += (int64_t)f2 * f2;
      H[0][1] += (int64_t)f1 * f2;
      C[0] += (int64_t)f1 * s;
      C[1] += (int64_t)f2 * s;
    }
  }
  H[0][0] /= size;
  H[0][1] /= size;
  H[1][1] /= size;
  H[1][0] = H[0][1];
  C[0] /= size;
  C[1] /= size;
}